

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::fetchLimits(CaptureVertexSeparate *this)

{
  deUint32 dVar1;
  long lVar2;
  undefined4 *puVar3;
  GLint max_varyings_components;
  GLint max_transform_feedback_separate_components;
  int local_20;
  int local_1c;
  
  lVar2 = (**(code **)(**(long **)(*(long *)(&this->field_0x78 +
                                            (long)this->_vptr_CaptureVertexSeparate[-3]) + 8) + 0x18
                      ))();
  (**(code **)(lVar2 + 0x868))(0x8c80,&local_1c);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"glGetIntegerv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc7a);
  if (3 < local_1c) {
    (**(code **)(lVar2 + 0x868))(0x8c8b,&this->m_max_transform_feedback_separate_attribs);
    dVar1 = (**(code **)(lVar2 + 0x800))();
    glu::checkError(dVar1,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xc83);
    if (this->m_max_transform_feedback_separate_attribs != 0) {
      *(GLint *)(&this->field_0x98 + (long)this->_vptr_CaptureVertexSeparate[-3]) =
           this->m_max_transform_feedback_separate_attribs << 2;
      local_20 = 0;
      (**(code **)(lVar2 + 0x868))(0x8b4b,&local_20);
      dVar1 = (**(code **)(lVar2 + 0x800))();
      glu::checkError(dVar1,"glGetIntegerv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xc90);
      if (local_20 != 0) {
        if (local_20 < *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureVertexSeparate[-3])) {
          *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureVertexSeparate[-3]) = local_20;
        }
        return;
      }
    }
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexSeparate::fetchLimits(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching limits. */
	glw::GLint max_transform_feedback_separate_components;

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS, &max_transform_feedback_separate_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_transform_feedback_separate_components < 4)
	{
		throw 0;
	}

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &m_max_transform_feedback_separate_attribs);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (m_max_transform_feedback_separate_attribs == 0)
	{
		throw 0;
	}

	m_max_transform_feedback_components = m_max_transform_feedback_separate_attribs * 4 /* vec4 is used */;

	glw::GLint max_varyings_components = 0;

	gl.getIntegerv(GL_MAX_VARYING_COMPONENTS, &max_varyings_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_varyings_components == 0)
	{
		throw 0;
	}

	if (m_max_transform_feedback_components > max_varyings_components)
	{
		m_max_transform_feedback_components = max_varyings_components;
	}
}